

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

int __thiscall QPlainTextEditPrivate::init(QPlainTextEditPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *pQVar1;
  QScrollBar *pQVar2;
  void **ppvVar3;
  QPlainTextEditControl *pQVar4;
  QTextDocument *this_00;
  QPlainTextDocumentLayout *this_01;
  QPalette *pal;
  undefined4 *puVar5;
  QPaintDevice *pQVar6;
  long in_FS_OFFSET;
  QObject local_c8 [8];
  QObject local_c0 [8];
  QObject local_b8 [8];
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  Connection local_88;
  QObject local_80 [8];
  QObject local_78 [8];
  Connection local_70;
  QObject local_68 [8];
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  QCursor local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  pQVar4 = (QPlainTextEditControl *)operator_new(0x28);
  QWidgetTextControl::QWidgetTextControl((QWidgetTextControl *)pQVar4,&pQVar1->super_QObject);
  *(undefined ***)&pQVar4->super_QWidgetTextControl = &PTR_metaObject_0080a4a0;
  pQVar4->textEdit = (QPlainTextEdit *)pQVar1;
  pQVar4->topBlock = 0;
  QWidgetTextControl::setAcceptRichText((QWidgetTextControl *)pQVar4,false);
  this->control = pQVar4;
  this_00 = (QTextDocument *)operator_new(0x10);
  QTextDocument::QTextDocument(this_00,(QObject *)pQVar4);
  this_01 = (QPlainTextDocumentLayout *)operator_new(0x10);
  QPlainTextDocumentLayout::QPlainTextDocumentLayout(this_01,this_00);
  QTextDocument::setDocumentLayout((QAbstractTextDocumentLayout *)this_00);
  QWidgetTextControl::setDocument((QWidgetTextControl *)this->control,this_00);
  pQVar4 = this->control;
  pal = QWidget::palette(pQVar1);
  QWidgetTextControl::setPalette((QWidgetTextControl *)pQVar4,pal);
  pQVar2 = (this->super_QAbstractScrollAreaPrivate).vbar;
  local_48.d = (QCursorData *)QAbstractSlider::actionTriggered;
  local_40 = 0;
  local_58 = verticalScrollbarActionTriggered;
  local_50 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QPlainTextEditPrivate::*)(int),_QtPrivate::List<int>,_void>::impl;
  *(code **)(puVar5 + 4) = verticalScrollbarActionTriggered;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar2,(QObject *)&local_48,ppvVar3,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pQVar4 = this->control;
  local_48.d = (QCursorData *)QWidgetTextControl::microFocusChanged;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x18);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qplaintextedit.cpp:753:22),_QtPrivate::List<>,_void>
       ::impl;
  *(QWidget **)(puVar5 + 4) = pQVar1;
  QObject::connectImpl
            (local_68,(void **)pQVar4,(QObject *)&local_48,(void **)pQVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pQVar4 = this->control;
  local_48.d = (QCursorData *)QWidgetTextControl::documentSizeChanged;
  local_40 = 0;
  local_58 = adjustScrollbars;
  local_50 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QPlainTextEditPrivate::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar5 + 4) = adjustScrollbars;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_70,(void **)pQVar4,(QObject *)&local_48,ppvVar3,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_70);
  pQVar4 = this->control;
  local_58 = QPlainTextEdit::blockCountChanged;
  local_50 = (ImplFn)0x0;
  local_48.d = (QCursorData *)QWidgetTextControl::blockCountChanged;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QPlainTextEdit::*)(int),_QtPrivate::List<int>,_void>::impl;
  *(code **)(puVar5 + 4) = QPlainTextEdit::blockCountChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_78,(void **)pQVar4,(QObject *)&local_48,(void **)pQVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  pQVar4 = this->control;
  local_48.d = (QCursorData *)QWidgetTextControl::updateRequest;
  local_40 = 0;
  local_58 = repaintContents;
  local_50 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QPlainTextEditPrivate::*)(const_QRectF_&),_QtPrivate::List<const_QRectF_&>,_void>
       ::impl;
  *(code **)(puVar5 + 4) = repaintContents;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_80,(void **)pQVar4,(QObject *)&local_48,ppvVar3,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  pQVar4 = this->control;
  local_58 = QPlainTextEdit::modificationChanged;
  local_50 = (ImplFn)0x0;
  local_48.d = (QCursorData *)QWidgetTextControl::modificationChanged;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QPlainTextEdit::*)(bool),_QtPrivate::List<bool>,_void>::impl
  ;
  *(code **)(puVar5 + 4) = QPlainTextEdit::modificationChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_88,(void **)pQVar4,(QObject *)&local_48,(void **)pQVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_88);
  pQVar4 = this->control;
  local_58 = QPlainTextEdit::textChanged;
  local_50 = (ImplFn)0x0;
  local_48.d = (QCursorData *)QWidgetTextControl::textChanged;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QPlainTextEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar5 + 4) = QPlainTextEdit::textChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_90,(void **)pQVar4,(QObject *)&local_48,(void **)pQVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  pQVar4 = this->control;
  local_58 = QPlainTextEdit::undoAvailable;
  local_50 = (ImplFn)0x0;
  local_48.d = (QCursorData *)QWidgetTextControl::undoAvailable;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QPlainTextEdit::*)(bool),_QtPrivate::List<bool>,_void>::impl
  ;
  *(code **)(puVar5 + 4) = QPlainTextEdit::undoAvailable;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_98,(void **)pQVar4,(QObject *)&local_48,(void **)pQVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  pQVar4 = this->control;
  local_58 = QPlainTextEdit::redoAvailable;
  local_50 = (ImplFn)0x0;
  local_48.d = (QCursorData *)QWidgetTextControl::redoAvailable;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QPlainTextEdit::*)(bool),_QtPrivate::List<bool>,_void>::impl
  ;
  *(code **)(puVar5 + 4) = QPlainTextEdit::redoAvailable;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_a0,(void **)pQVar4,(QObject *)&local_48,(void **)pQVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  pQVar4 = this->control;
  local_58 = QPlainTextEdit::copyAvailable;
  local_50 = (ImplFn)0x0;
  local_48.d = (QCursorData *)QWidgetTextControl::copyAvailable;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QPlainTextEdit::*)(bool),_QtPrivate::List<bool>,_void>::impl
  ;
  *(code **)(puVar5 + 4) = QPlainTextEdit::copyAvailable;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_a8,(void **)pQVar4,(QObject *)&local_48,(void **)pQVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  pQVar4 = this->control;
  local_58 = QPlainTextEdit::selectionChanged;
  local_50 = (ImplFn)0x0;
  local_48.d = (QCursorData *)QWidgetTextControl::selectionChanged;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QPlainTextEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar5 + 4) = QPlainTextEdit::selectionChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_b0,(void **)pQVar4,(QObject *)&local_48,(void **)pQVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  pQVar4 = this->control;
  local_48.d = (QCursorData *)QWidgetTextControl::cursorPositionChanged;
  local_40 = 0;
  local_58 = cursorPositionChanged;
  local_50 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QPlainTextEditPrivate::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar5 + 4) = cursorPositionChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_b8,(void **)pQVar4,(QObject *)&local_48,ppvVar3,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  pQVar4 = this->control;
  local_48.d = (QCursorData *)QWidgetTextControl::textChanged;
  local_40 = 0;
  local_58 = updatePlaceholderVisibility;
  local_50 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QPlainTextEditPrivate::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar5 + 4) = updatePlaceholderVisibility;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_c0,(void **)pQVar4,(QObject *)&local_48,ppvVar3,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  pQVar4 = this->control;
  local_48.d = (QCursorData *)QWidgetTextControl::textChanged;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x18);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qplaintextedit.cpp:771:68),_QtPrivate::List<>,_void>
       ::impl;
  *(QWidget **)(puVar5 + 4) = pQVar1;
  QObject::connectImpl
            (local_c8,(void **)pQVar4,(QObject *)&local_48,(void **)pQVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  QTextDocument::setTextWidth(-1.0);
  pQVar6 = (QPaintDevice *)QTextDocument::documentLayout();
  QAbstractTextDocumentLayout::setPaintDevice(pQVar6);
  QTextDocument::setDefaultFont((QFont *)this_00);
  if (*(long *)(ctx + 0x10) != 0) {
    QWidgetTextControl::setPlainText((QWidgetTextControl *)this->control,(QString *)ctx);
  }
  QAbstractSlider::setSingleStep
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0x14);
  QAbstractSlider::setSingleStep
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,1);
  QWidget::setBackgroundRole((this->super_QAbstractScrollAreaPrivate).viewport,Base);
  QWidget::setAcceptDrops(pQVar1,true);
  QWidget::setFocusPolicy(pQVar1,StrongFocus);
  QWidget::setAttribute(pQVar1,WA_KeyCompression,true);
  QWidget::setAttribute(pQVar1,WA_InputMethodEnabled,true);
  QWidget::setInputMethodHints(pQVar1,(InputMethodHints)0x400);
  pQVar1 = (this->super_QAbstractScrollAreaPrivate).viewport;
  QCursor::QCursor(&local_48,IBeamCursor);
  QWidget::setCursor(pQVar1,&local_48);
  QCursor::~QCursor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::init(const QString &txt)
{
    Q_Q(QPlainTextEdit);
    control = new QPlainTextEditControl(q);

    QTextDocument *doc = new QTextDocument(control);
    QAbstractTextDocumentLayout *layout = new QPlainTextDocumentLayout(doc);
    doc->setDocumentLayout(layout);
    control->setDocument(doc);

    control->setPalette(q->palette());

    QObjectPrivate::connect(vbar, &QAbstractSlider::actionTriggered,
                            this, &QPlainTextEditPrivate::verticalScrollbarActionTriggered);
    QObject::connect(control, &QWidgetTextControl::microFocusChanged, q,
                     [q](){q->updateMicroFocus(); });
    QObjectPrivate::connect(control, &QWidgetTextControl::documentSizeChanged,
                            this, &QPlainTextEditPrivate::adjustScrollbars);
    QObject::connect(control, &QWidgetTextControl::blockCountChanged,
                     q, &QPlainTextEdit::blockCountChanged);
    QObjectPrivate::connect(control, &QWidgetTextControl::updateRequest,
                            this, &QPlainTextEditPrivate::repaintContents);
    QObject::connect(control, &QWidgetTextControl::modificationChanged,
                     q, &QPlainTextEdit::modificationChanged);
    QObject::connect(control, &QWidgetTextControl::textChanged, q, &QPlainTextEdit::textChanged);
    QObject::connect(control, &QWidgetTextControl::undoAvailable, q, &QPlainTextEdit::undoAvailable);
    QObject::connect(control, &QWidgetTextControl::redoAvailable, q, &QPlainTextEdit::redoAvailable);
    QObject::connect(control, &QWidgetTextControl::copyAvailable, q, &QPlainTextEdit::copyAvailable);
    QObject::connect(control, &QWidgetTextControl::selectionChanged, q, &QPlainTextEdit::selectionChanged);
    QObjectPrivate::connect(control, &QWidgetTextControl::cursorPositionChanged,
                            this, &QPlainTextEditPrivate::cursorPositionChanged);
    QObjectPrivate::connect(control, &QWidgetTextControl::textChanged,
                            this, &QPlainTextEditPrivate::updatePlaceholderVisibility);
    QObject::connect(control, &QWidgetTextControl::textChanged, q, [q](){q->updateMicroFocus(); });

    // set a null page size initially to avoid any relayouting until the textedit
    // is shown. relayoutDocument() will take care of setting the page size to the
    // viewport dimensions later.
    doc->setTextWidth(-1);
    doc->documentLayout()->setPaintDevice(viewport);
    doc->setDefaultFont(q->font());


    if (!txt.isEmpty())
        control->setPlainText(txt);

    hbar->setSingleStep(20);
    vbar->setSingleStep(1);

    viewport->setBackgroundRole(QPalette::Base);
    q->setAcceptDrops(true);
    q->setFocusPolicy(Qt::StrongFocus);
    q->setAttribute(Qt::WA_KeyCompression);
    q->setAttribute(Qt::WA_InputMethodEnabled);
    q->setInputMethodHints(Qt::ImhMultiLine);

#ifndef QT_NO_CURSOR
    viewport->setCursor(Qt::IBeamCursor);
#endif
}